

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogToFile(int auto_open_depth,char *filename)

{
  ImGuiContext *pIVar1;
  FILE *pFVar2;
  FILE *f;
  ImGuiContext *g;
  char *filename_local;
  int auto_open_depth_local;
  
  pIVar1 = GImGui;
  if ((GImGui->LogEnabled & 1U) == 0) {
    g = (ImGuiContext *)filename;
    if (filename == (char *)0x0) {
      g = (ImGuiContext *)(GImGui->IO).LogFilename;
    }
    if ((g != (ImGuiContext *)0x0) && (g->Initialized != false)) {
      pFVar2 = ImFileOpen(&g->Initialized,"ab");
      if (pFVar2 == (FILE *)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                      ,0x241b,"void ImGui::LogToFile(int, const char *)");
      }
      LogBegin(ImGuiLogType_File,auto_open_depth);
      pIVar1->LogFile = pFVar2;
    }
  }
  return;
}

Assistant:

void ImGui::LogToFile(int auto_open_depth, const char* filename)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;

    // FIXME: We could probably open the file in text mode "at", however note that clipboard/buffer logging will still
    // be subject to outputting OS-incompatible carriage return if within strings the user doesn't use IM_NEWLINE.
    // By opening the file in binary mode "ab" we have consistent output everywhere.
    if (!filename)
        filename = g.IO.LogFilename;
    if (!filename || !filename[0])
        return;
    FILE* f = ImFileOpen(filename, "ab");
    if (f == NULL)
    {
        IM_ASSERT(0);
        return;
    }

    LogBegin(ImGuiLogType_File, auto_open_depth);
    g.LogFile = f;
}